

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

Group * __thiscall SceneParser::parseGroup(SceneParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Group *this_00;
  Material *pMVar4;
  int iVar5;
  Object3D *object;
  char token [100];
  
  getToken(this,token);
  if (token._0_2_ != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x117,"Group *SceneParser::parseGroup()");
  }
  getToken(this,token);
  iVar2 = bcmp(token,"numObjects",0xb);
  if (iVar2 == 0) {
    iVar2 = readInt(this);
    this_00 = (Group *)operator_new(0x48);
    (this_00->super_Object3D).type._M_string_length = 0;
    (this_00->super_Object3D).type.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(this_00->super_Object3D).type.field_2 + 8) = 0;
    (this_00->super_Object3D).material = (Material *)0x0;
    (this_00->super_Object3D).type._M_dataplus._M_p =
         (pointer)&(this_00->super_Object3D).type.field_2;
    (this_00->super_Object3D).type.field_2._M_local_buf[0] = '\0';
    (this_00->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Group_0013aa10;
    (this_00->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = false;
    iVar5 = 0;
    while( true ) {
      while( true ) {
        getToken(this,token);
        if (iVar2 <= iVar5) {
          if (token._0_2_ == 0x7d) {
            return this_00;
          }
          __assert_fail("!strcmp(token, \"}\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                        ,0x137,"Group *SceneParser::parseGroup()");
        }
        iVar3 = bcmp(token,"MaterialIndex",0xe);
        if (iVar3 == 0) break;
        object = parseObject(this,token);
        Group::addObject(this_00,object);
        std::vector<Object3D_*,_std::allocator<Object3D_*>_>::push_back(&this->_objects,&object);
        if (bVar1 != false) {
          std::vector<Object3D_*,_std::allocator<Object3D_*>_>::push_back(&this->lights,&object);
        }
        iVar5 = iVar5 + 1;
      }
      iVar3 = readInt(this);
      if ((iVar3 < 0) || (this->_num_materials < iVar3)) break;
      pMVar4 = getMaterial(this,iVar3);
      this->_current_material = pMVar4;
      bVar1 = operator!=(&pMVar4->_light,&Vector3f::ZERO);
    }
    __assert_fail("index >= 0 && index <= getNumMaterials()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x128,"Group *SceneParser::parseGroup()");
  }
  __assert_fail("!strcmp(token, \"numObjects\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x11b,"Group *SceneParser::parseGroup()");
}

Assistant:

Group *
SceneParser::parseGroup() {
    // Each group starts with an integer that specifies
    // the number of objects in the group.
    //
    // The material index sets the material of all objects which follow,
    // until the next material index (scoping for the materials is very
    // simple, and essentially ignores any tree hierarchy).
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));

    // Read in the number of objects.
    getToken(token);
    assert(!strcmp(token, "numObjects"));
    int num_objects = readInt();

    Group *answer = new Group();

    // Read in the objects.
    int count = 0;
    bool in_light = false;
    while (num_objects > count) {
        getToken(token);
        if (!strcmp(token, "MaterialIndex")) {
            // Change the current material.
            int index = readInt();
            assert(index >= 0 && index <= getNumMaterials());
            _current_material = getMaterial(index);
            in_light = _current_material->getLight() != Vector3f::ZERO;
        } else {
            Object3D *object = parseObject(token);
            assert(object != NULL);
            answer->addObject(object);
            count++;
            _objects.push_back(object);
            if (in_light) {
                lights.push_back(object);
            }
        }
    }
    getToken(token);
    assert(!strcmp(token, "}"));

    // Return the group.
    return answer;
}